

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O2

int sp_dgemv(char *trans,double alpha,SuperMatrix *A,double *x,int incx,double beta,double *y,
            int incy)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  bool bVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  double *pdVar19;
  bool bVar20;
  double dVar21;
  char msg [256];
  
  cVar2 = *trans;
  pvVar7 = A->Store;
  lVar8 = *(long *)((long)pvVar7 + 8);
  bVar9 = true;
  if (cVar2 != 'N') {
    if ((cVar2 == 'C') || (cVar2 == 'T')) {
      bVar9 = false;
    }
    else if (cVar2 != 'n') {
      msg[0] = '\x01';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      goto LAB_0010c98f;
    }
  }
  uVar3 = A->nrow;
  if (-1 < (int)uVar3) {
    uVar4 = A->ncol;
    lVar12 = (long)(int)uVar4;
    if (-1 < lVar12) {
      if (incx == 0) {
        msg[0] = '\x05';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
      }
      else {
        if (incy != 0) {
          if (uVar4 == 0 || uVar3 == 0) {
            return 0;
          }
          if ((((alpha == 0.0) && (!NAN(alpha))) && (beta == 1.0)) && (!NAN(beta))) {
            return 0;
          }
          uVar17 = uVar3;
          if (cVar2 != 'N') {
            uVar17 = uVar4;
            uVar4 = uVar3;
          }
          iVar5 = (1 - uVar4) * incx;
          if (0 < incx) {
            iVar5 = 0;
          }
          iVar6 = (1 - uVar17) * incy;
          if (0 < incy) {
            iVar6 = 0;
          }
          lVar15 = (long)incy;
          if ((beta != 1.0) || (NAN(beta))) {
            if (incy == 1) {
              if ((beta != 0.0) || (NAN(beta))) {
                for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
                  y[uVar18] = y[uVar18] * beta;
                }
              }
              else {
                for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
                  y[uVar18] = 0.0;
                }
              }
            }
            else {
              pdVar19 = y + iVar6;
              if ((beta != 0.0) || (NAN(beta))) {
                while (bVar20 = uVar17 != 0, uVar17 = uVar17 - 1, bVar20) {
                  *pdVar19 = *pdVar19 * beta;
                  pdVar19 = pdVar19 + lVar15;
                }
              }
              else {
                while (bVar20 = uVar17 != 0, uVar17 = uVar17 - 1, bVar20) {
                  *pdVar19 = 0.0;
                  pdVar19 = pdVar19 + lVar15;
                }
              }
            }
          }
          if ((alpha == 0.0) && (!NAN(alpha))) {
            return 0;
          }
          if (bVar9) {
            if (incy == 1) {
              lVar15 = (long)iVar5;
              for (lVar13 = 0; lVar13 != lVar12; lVar13 = lVar13 + 1) {
                dVar21 = x[lVar15];
                if ((dVar21 != 0.0) || (NAN(dVar21))) {
                  iVar5 = *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar13 * 4);
                  for (lVar16 = (long)*(int *)(*(long *)((long)pvVar7 + 0x18) + lVar13 * 4);
                      lVar16 < iVar5; lVar16 = lVar16 + 1) {
                    iVar6 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar16 * 4);
                    y[iVar6] = *(double *)(lVar8 + lVar16 * 8) * dVar21 * alpha + y[iVar6];
                  }
                }
                lVar15 = lVar15 + incx;
              }
              return 0;
            }
            uVar10 = 0x1ce;
          }
          else {
            if (incx == 1) {
              lVar16 = (long)iVar6;
              lVar13 = *(long *)((long)pvVar7 + 0x18);
              lVar14 = 0;
              while (lVar14 != lVar12) {
                lVar11 = lVar14 * 4;
                lVar1 = lVar14 * 4;
                lVar14 = lVar14 + 1;
                dVar21 = 0.0;
                for (lVar11 = (long)*(int *)(lVar13 + lVar11); lVar11 < *(int *)(lVar13 + 4 + lVar1)
                    ; lVar11 = lVar11 + 1) {
                  dVar21 = dVar21 + *(double *)(lVar8 + lVar11 * 8) *
                                    x[*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar11 * 4)];
                }
                y[lVar16] = dVar21 * alpha + y[lVar16];
                lVar16 = lVar16 + lVar15;
              }
              return 0;
            }
            uVar10 = 0x1de;
          }
          sprintf(msg,"%s at line %d in file %s\n","Not implemented.",uVar10,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
                 );
          superlu_abort_and_exit(msg);
        }
        msg[0] = '\b';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
      }
      goto LAB_0010c98f;
    }
  }
  msg[0] = '\x03';
  msg[1] = '\0';
  msg[2] = '\0';
  msg[3] = '\0';
LAB_0010c98f:
  input_error("sp_dgemv ",(int *)msg);
  return 0;
}

Assistant:

int
sp_dgemv(char *trans, double alpha, SuperMatrix *A, double *x, 
	 int incx, double beta, double *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    double   *Aval;
    int info;
    double temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_dgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}